

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * strtok(char *__s,char *__delim)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  int ch;
  char *delim_local;
  char *s_local;
  
  pcVar3 = __s;
  if (__s == (char *)0x0) {
    delim_local = strtok::last;
    pcVar3 = delim_local;
  }
  do {
    delim_local = pcVar3;
    if (*delim_local == 0) {
      return (char *)0x0;
    }
    pcVar1 = strchr(__delim,(int)*delim_local);
    pcVar3 = delim_local + 1;
  } while (pcVar1 != (char *)0x0);
  sVar2 = strcspn(delim_local,__delim);
  pcVar3 = delim_local + sVar2;
  strtok::last = pcVar3;
  if (*pcVar3 != '\0') {
    strtok::last = pcVar3 + 1;
    *pcVar3 = '\0';
  }
  return delim_local;
}

Assistant:

char *strtok(char *s, const char *delim) {
    static char *last;

    if (s == NULL) {
        s = last;
    }
    int ch;
    do {
        ch = *s++;
        if (ch == '\0') {
            return NULL;
        }
    } while (strchr(delim, ch));
    --s;
    last = s + strcspn(s, delim);
    if (*last != '\0') {
        *last++ = '\0';
    }
    return s;
}